

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb.c
# Opt level: O0

int cubeb_set_log_callback(cubeb_log_level log_level,cubeb_log_callback log_callback)

{
  cubeb_log_callback p_Var1;
  long in_RSI;
  uint in_EDI;
  cubeb_log_callback in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  if (in_EDI < 3) {
    if ((in_RSI == 0) && (in_EDI != 0)) {
      local_4 = -3;
    }
    else {
      p_Var1 = cubeb_log_get_callback();
      if ((p_Var1 == (cubeb_log_callback)0x0) || (in_RSI == 0)) {
        cubeb_log_set((cubeb_log_level)((ulong)in_RSI >> 0x20),in_stack_ffffffffffffffe8);
        local_4 = 0;
      }
      else {
        local_4 = -4;
      }
    }
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int
cubeb_set_log_callback(cubeb_log_level log_level,
                       cubeb_log_callback log_callback)
{
  if (log_level < CUBEB_LOG_DISABLED || log_level > CUBEB_LOG_VERBOSE) {
    return CUBEB_ERROR_INVALID_FORMAT;
  }

  if (!log_callback && log_level != CUBEB_LOG_DISABLED) {
    return CUBEB_ERROR_INVALID_PARAMETER;
  }

  if (cubeb_log_get_callback() && log_callback) {
    return CUBEB_ERROR_NOT_SUPPORTED;
  }

  cubeb_log_set(log_level, log_callback);

  return CUBEB_OK;
}